

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

string * __thiscall
t_go_generator::module_name_abi_cxx11_
          (string *__return_storage_ptr__,t_go_generator *this,t_type *ttype)

{
  t_go_generator *this_00;
  t_program *ptVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  t_program *extraout_RDX;
  t_program *extraout_RDX_00;
  t_program *extraout_RDX_01;
  t_program *extraout_RDX_02;
  t_program *extraout_RDX_03;
  t_program *extraout_RDX_04;
  t_program *extraout_RDX_05;
  t_program *extraout_RDX_06;
  t_program *extraout_RDX_07;
  t_program *extraout_RDX_08;
  t_program *extraout_RDX_09;
  bool bVar6;
  string module;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (t_go_generator *)ttype->program_;
  if ((this_00 == (t_go_generator *)0x0) ||
     (this_00 == (t_go_generator *)(this->super_t_generator).program_)) goto LAB_00210d60;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"go","");
  t_program::get_namespace(&local_110,(t_program *)this_00,&local_130);
  bVar6 = true;
  ptVar1 = extraout_RDX;
  if (local_110._M_string_length == 0) {
LAB_00210c53:
    local_90._M_string_length = (size_type)ptVar1;
    bVar3 = false;
  }
  else {
    ptVar1 = (this->super_t_generator).program_;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"go","");
    t_program::get_namespace(&local_50,ptVar1,&local_d0);
    ptVar1 = extraout_RDX_00;
    if (local_50._M_string_length == 0) goto LAB_00210c53;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"go","");
    t_program::get_namespace(&local_90,(t_program *)this_00,&local_f0);
    ptVar1 = (this->super_t_generator).program_;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"go","");
    t_program::get_namespace(&local_70,ptVar1,&local_b0);
    bVar3 = true;
    if (local_90._M_string_length == local_70._M_string_length) {
      if ((t_program *)local_90._M_string_length == (t_program *)0x0) {
        bVar6 = false;
      }
      else {
        iVar4 = bcmp(local_90._M_dataplus._M_p,local_70._M_dataplus._M_p,local_90._M_string_length);
        bVar6 = iVar4 != 0;
        local_90._M_string_length = (size_type)extraout_RDX_01;
      }
    }
    else {
      bVar6 = true;
    }
  }
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_05;
    }
  }
  if (local_110._M_string_length != 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_06;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
      local_90._M_string_length = (size_type)extraout_RDX_07;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
    local_90._M_string_length = (size_type)extraout_RDX_08;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
    local_90._M_string_length = (size_type)extraout_RDX_09;
  }
  if (bVar6) {
    get_real_go_module_abi_cxx11_(&local_110,this_00,(t_program *)local_90._M_string_length);
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->package_identifiers_,&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pmVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pmVar5->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_110._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
LAB_00210d60:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string t_go_generator::module_name(t_type* ttype) {
  t_program* program = ttype->get_program();

  if (program != nullptr && program != program_) {
    if (program->get_namespace("go").empty() ||
        program_->get_namespace("go").empty() ||
        program->get_namespace("go") != program_->get_namespace("go")) {
      string module(get_real_go_module(program));
      return package_identifiers_[module];
    }
  }

  return "";
}